

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnStartFunction(BinaryReaderIR *this,Index func_index)

{
  Module *this_00;
  Var start;
  long *local_90;
  Location local_88;
  Var local_68;
  
  GetLocation(&local_88,this);
  Var::Var(&local_68,func_index,&local_88);
  this_00 = this->module_;
  GetLocation(&local_88,this);
  MakeUnique<wabt::StartModuleField,wabt::Var&,wabt::Location>
            ((wabt *)&local_90,&local_68,&local_88);
  Module::AppendField(this_00,(unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
                               *)&local_90);
  if (local_90 != (long *)0x0) {
    (**(code **)(*local_90 + 8))();
  }
  local_90 = (long *)0x0;
  Var::~Var(&local_68);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnStartFunction(Index func_index) {
  Var start(func_index, GetLocation());
  module_->AppendField(MakeUnique<StartModuleField>(start, GetLocation()));
  return Result::Ok;
}